

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O1

int write_normal_data_chunk(output_file *out,uint len,void *data)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = out->block_size;
  uVar3 = (len + uVar1) - 1;
  iVar2 = (*out->ops->write)(out,data,(size_t)len);
  if ((-1 < iVar2) &&
     (uVar3 = uVar3 - uVar3 % uVar1, iVar4 = uVar3 - len, len <= uVar3 && iVar4 != 0)) {
    iVar2 = (*out->ops->skip)(out,(int64_t)iVar4);
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int write_normal_data_chunk(struct output_file* out, unsigned int len, void* data) {
  int ret;
  unsigned int rnd_up_len = ALIGN(len, out->block_size);

  ret = out->ops->write(out, data, len);
  if (ret < 0) {
    return ret;
  }

  if (rnd_up_len > len) {
    ret = out->ops->skip(out, rnd_up_len - len);
  }

  return ret;
}